

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ConfigError::~ConfigError(ConfigError *this)

{
  void *in_RDI;
  
  ~ConfigError((ConfigError *)0x17dc58);
  operator_delete(in_RDI);
  return;
}

Assistant:

static ConfigError Extras(std::string item) { return ConfigError("INI was not able to parse " + item); }